

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O1

void RDL_giveVertices(uint a,uint b,char *array,RDL_sPathInfo *spi,char *visited)

{
  uint b_00;
  RDL_graph *pRVar1;
  ulong uVar2;
  
  visited[b] = '\x01';
  if (a == b) {
    array[a] = '\x01';
  }
  else {
    array[b] = '\x01';
    pRVar1 = spi->dPaths[a];
    if (pRVar1->degree[b] != 0) {
      uVar2 = 0;
      do {
        b_00 = pRVar1->adjList[b][uVar2][0];
        if (visited[b_00] == '\0') {
          RDL_giveVertices(a,b_00,array,spi,visited);
        }
        uVar2 = uVar2 + 1;
        pRVar1 = spi->dPaths[a];
      } while (uVar2 < pRVar1->degree[b]);
    }
  }
  return;
}

Assistant:

void RDL_giveVertices(unsigned a, unsigned b, char *array,
    const RDL_sPathInfo *spi, char *visited)
{
 /* similar to the function "List_Paths" from Vismara*/
  unsigned i, vertex;

  visited[b] = 1;

  if(a==b)
  {
    array[a] = 1;
    return;
  }
  array[b] = 1;
  /*for each vertex adjacent to b in U_a*/
  for(i=0; i<spi->dPaths[a]->degree[b]; ++i)
  {
    vertex = spi->dPaths[a]->adjList[b][i][0];
    if (!visited[vertex]) {
      RDL_giveVertices(a, vertex, array, spi, visited);
    }
  }
}